

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::
scanType(TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector> *this,Type *type)

{
  bool bVar1;
  TypeInfo *pTVar2;
  reference type_00;
  Task TVar3;
  value_type local_60;
  value_type local_50;
  undefined1 local_40 [16];
  reverse_iterator it;
  TypeList *types;
  TypeInfo *info;
  Type *type_local;
  TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector> *this_local;
  
  bVar1 = wasm::Type::isBasic(type);
  if (!bVar1) {
    pTVar2 = getTypeInfo((Type)type->id);
    if (pTVar2->kind == TupleKind) {
      it.current._M_current =
           (__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>)
           &pTVar2->field_2;
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::rbegin
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)(local_40 + 8));
      while( true ) {
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::rend
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_40);
        bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
                                 *)(local_40 + 8),
                                (reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
                                 *)local_40);
        if (!bVar1) break;
        type_00 = std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
                  ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
                               *)(local_40 + 8));
        TVar3 = Task::scan(type_00);
        local_50.field_1 = TVar3.field_1;
        local_50.kind = TVar3.kind;
        std::
        vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
        ::push_back(&this->taskList,&local_50);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
                      *)(local_40 + 8));
      }
    }
    else if (pTVar2->kind == RefKind) {
      TVar3 = Task::scan((HeapType *)&(pTVar2->field_2).tuple);
      local_60.field_1 = TVar3.field_1;
      local_60.kind = TVar3.kind;
      std::
      vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
      ::push_back(&this->taskList,&local_60);
    }
  }
  return;
}

Assistant:

void TypeGraphWalkerBase<Self>::scanType(Type* type) {
  if (type->isBasic()) {
    return;
  }
  auto* info = getTypeInfo(*type);
  switch (info->kind) {
    case TypeInfo::TupleKind: {
      auto& types = info->tuple.types;
      for (auto it = types.rbegin(); it != types.rend(); ++it) {
        taskList.push_back(Task::scan(&*it));
      }
      break;
    }
    case TypeInfo::RefKind: {
      taskList.push_back(Task::scan(&info->ref.heapType));
      break;
    }
  }
}